

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StateMachinePattern.cpp
# Opt level: O3

void __thiscall State3::executeStateTask(State3 *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  element_type *peVar2;
  element_type *peVar3;
  pointer psVar4;
  pointer psVar5;
  int iVar6;
  size_t sVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  peVar2 = (this->super_State).spData.super___shared_ptr<Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  paVar1 = &local_38.field_2;
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"State 3 was here","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)peVar2,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  peVar3 = (this->super_State).spStatus.super___shared_ptr<Status,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"STM: Executing state 3","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((peVar3->spExecMessage).
              super___shared_ptr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  do {
    iVar6 = rand();
    iVar6 = iVar6 % 4 + 1;
    sVar7 = (size_t)iVar6;
    peVar2 = (this->super_State).spData.super___shared_ptr<Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  } while (peVar2->nPreviousRandomNumber == sVar7);
  peVar2->nPreviousRandomNumber = sVar7;
  if (iVar6 == 4) {
    peVar3 = (this->super_State).spStatus.super___shared_ptr<Status,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    peVar3->bExecutionStatus = false;
    local_38._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,"STM ERROR: Transition from state 3 to State 4 is forbidden!","")
    ;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((peVar3->spExecMessage).
                super___shared_ptr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != paVar1) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    ((this->super_State).spData.super___shared_ptr<Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    bChangeState = false;
    psVar4 = (this->super_State).spPossibleNextStates.
             super__Vector_base<std::shared_ptr<State>,_std::allocator<std::shared_ptr<State>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    (this->super_State).spNextState.super___shared_ptr<State,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         psVar4[1].super___shared_ptr<State,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    psVar4 = psVar4 + 1;
  }
  else {
    psVar5 = (this->super_State).spPossibleNextStates.
             super__Vector_base<std::shared_ptr<State>,_std::allocator<std::shared_ptr<State>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    psVar4 = psVar5 + (sVar7 - 1);
    (this->super_State).spNextState.super___shared_ptr<State,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         psVar5[sVar7 - 1].super___shared_ptr<State,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->super_State).spNextState.super___shared_ptr<State,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             ((long)&psVar4->super___shared_ptr<State,_(__gnu_cxx::_Lock_policy)2> + 8));
  return;
}

Assistant:

void State3::executeStateTask()
{
    spData->vGuestBook.push_back( "State 3 was here" );
    spStatus->setStatusMessage("STM: Executing state 3");
    
    size_t nRsandNum = ( rand() % 4 ) + 1;

    while(spData->nPreviousRandomNumber == nRsandNum)
    {
        nRsandNum = ( rand() % 4 ) + 1;
    }
     
    spData->nPreviousRandomNumber = nRsandNum;
    
    if(nRsandNum == 4)
    {
        spStatus->setStatus(false);
        spStatus->setStatusMessage("STM ERROR: Transition from state 3 to State 4 is forbidden!");
        spData->bChangeState = false;
        spNextState = spPossibleNextStates[1];
    }
    else
    {
        spNextState = spPossibleNextStates[nRsandNum-1];
    }
    
}